

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O2

ExpressionValue *
expFuncOutputName(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
                 vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  int iVar1;
  undefined4 extraout_var;
  shared_ptr<AssemblerFile> file;
  string local_70;
  StringLiteral local_50;
  string value;
  
  std::__shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&file.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>,
             &(g_fileManager->activeFile).
              super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>);
  if (file.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    Logger::queueError<>(Error,"outputName: no file opened");
    (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
    (__return_storage_ptr__->strValue)._value._M_string_length = 0;
    (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->type = Invalid;
    (__return_storage_ptr__->field_1).intValue = 0;
  }
  else {
    iVar1 = (*(file.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_AssemblerFile[0xf])();
    ghc::filesystem::path::u8string_abi_cxx11_(&value,(path *)CONCAT44(extraout_var,iVar1));
    std::__cxx11::string::string((string *)&local_70,(string *)&value);
    StringLiteral::StringLiteral(&local_50,&local_70);
    ExpressionValue::ExpressionValue(__return_storage_ptr__,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&value);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&file.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expFuncOutputName(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	std::shared_ptr<AssemblerFile> file = g_fileManager->getOpenFile();
	if (file == nullptr)
	{
		Logger::queueError(Logger::Error, "outputName: no file opened");
		return ExpressionValue();
	}

	std::string value = file->getFileName().u8string();
	return ExpressionValue(value);
}